

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O3

void __thiscall spvtools::opt::analysis::LivenessManager::ComputeLiveness(LivenessManager *this)

{
  IRContext *this_00;
  Module *pMVar1;
  DefUseManager *this_01;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  IRContext *pIVar5;
  Instruction *pIVar6;
  uint uVar7;
  Instruction *pIVar8;
  Instruction *this_02;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  InitializeAnalysis(this);
  this_00 = this->ctx_;
  pIVar5 = this_00;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
    pIVar5 = this->ctx_;
  }
  pMVar1 = (pIVar5->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_02 = *(Instruction **)
             ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  pIVar8 = (Instruction *)
           ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  if (this_02 != pIVar8) {
    this_01 = (this_00->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    do {
      if (this_02->opcode_ == OpVariable) {
        uVar3 = 0;
        if (this_02->has_type_id_ == true) {
          uVar3 = Instruction::GetSingleWordOperand(this_02,0);
        }
        pIVar6 = DefUseManager::GetDef(this_01,uVar3);
        if (pIVar6->opcode_ != OpTypePointer) {
          __assert_fail("var_type_inst->opcode() == spv::Op::OpTypePointer && \"Expected a pointer type\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/liveness.cpp"
                        ,0x12f,"void spvtools::opt::analysis::LivenessManager::ComputeLiveness()");
        }
        uVar3 = (pIVar6->has_result_id_ & 1) + 1;
        if (pIVar6->has_type_id_ == false) {
          uVar3 = (uint)pIVar6->has_result_id_;
        }
        uVar3 = Instruction::GetSingleWordOperand(pIVar6,uVar3);
        if (uVar3 == 1) {
          uVar3 = 0;
          if (this_02->has_result_id_ == true) {
            uVar3 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
          }
          bVar2 = AnalyzeBuiltIn(this,uVar3);
          if (!bVar2) {
            uVar7 = (pIVar6->has_result_id_ & 1) + 1;
            if (pIVar6->has_type_id_ == false) {
              uVar7 = (uint)pIVar6->has_result_id_;
            }
            uVar4 = Instruction::GetSingleWordOperand(pIVar6,uVar7 + 1);
            pIVar6 = DefUseManager::GetDef(this_01,uVar4);
            if (pIVar6->opcode_ == OpTypeArray) {
              uVar4 = (pIVar6->has_result_id_ & 1) + 1;
              if (pIVar6->has_type_id_ == false) {
                uVar4 = (uint)pIVar6->has_result_id_;
              }
              uVar4 = Instruction::GetSingleWordOperand(pIVar6,uVar4);
              pIVar6 = DefUseManager::GetDef(this_01,uVar4);
              if (pIVar6->opcode_ == OpTypeStruct) {
                bVar2 = AnalyzeBuiltIn(this,uVar4);
                if (bVar2) goto LAB_0023a579;
              }
            }
            local_38 = std::
                       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/liveness.cpp:329:38)>
                       ::_M_invoke;
            local_40 = std::
                       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/liveness.cpp:329:38)>
                       ::_M_manager;
            local_50._M_unused._M_object = this;
            local_50._8_8_ = this_02;
            DefUseManager::ForEachUser
                      (this_01,uVar3,(function<void_(spvtools::opt::Instruction_*)> *)&local_50);
            if (local_40 != (code *)0x0) {
              (*local_40)(&local_50,&local_50,__destroy_functor);
            }
          }
        }
      }
LAB_0023a579:
      this_02 = (this_02->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (this_02 != pIVar8);
  }
  return;
}

Assistant:

void LivenessManager::ComputeLiveness() {
  InitializeAnalysis();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  // Process all input variables
  for (auto& var : context()->types_values()) {
    if (var.opcode() != spv::Op::OpVariable) {
      continue;
    }
    Instruction* var_type_inst = def_use_mgr->GetDef(var.type_id());
    assert(var_type_inst->opcode() == spv::Op::OpTypePointer &&
           "Expected a pointer type");
    const uint32_t kPointerTypeStorageClassInIdx = 0;
    spv::StorageClass sc = static_cast<spv::StorageClass>(
        var_type_inst->GetSingleWordInOperand(kPointerTypeStorageClassInIdx));
    if (sc != spv::StorageClass::Input) {
      continue;
    }
    // If var is builtin, mark live if analyzed and continue to next variable
    auto var_id = var.result_id();
    if (AnalyzeBuiltIn(var_id)) continue;
    // If interface block with builtin members, mark live if analyzed and
    // continue to next variable. Input interface blocks will only appear
    // in tesc, tese and geom shaders. Will need to strip off one level of
    // arrayness to get to block type.
    const uint32_t kPointerTypePointeeTypeInIdx = 1;
    uint32_t pte_type_id =
        var_type_inst->GetSingleWordInOperand(kPointerTypePointeeTypeInIdx);
    Instruction* pte_type_inst = def_use_mgr->GetDef(pte_type_id);
    if (pte_type_inst->opcode() == spv::Op::OpTypeArray) {
      uint32_t array_elt_type_id = pte_type_inst->GetSingleWordInOperand(0);
      Instruction* arr_elt_type = def_use_mgr->GetDef(array_elt_type_id);
      if (arr_elt_type->opcode() == spv::Op::OpTypeStruct) {
        if (AnalyzeBuiltIn(array_elt_type_id)) continue;
      }
    }
    // Mark all used locations of var live
    def_use_mgr->ForEachUser(var_id, [this, &var](Instruction* user) {
      auto op = user->opcode();
      if (op == spv::Op::OpEntryPoint || op == spv::Op::OpName ||
          op == spv::Op::OpDecorate || user->IsNonSemanticInstruction()) {
        return;
      }
      MarkRefLive(user, &var);
    });
  }
}